

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

bool __thiscall
MemoryManager::setShort(MemoryManager *this,uint32_t addr,uint16_t val,uint32_t *cycles)

{
  bool bVar1;
  
  if ((this->memory[addr >> 0x16] == (uint8_t **)0x0) ||
     (*(long *)((long)this->memory[addr >> 0x16] + (ulong)(addr >> 9 & 0x1ff8)) == 0)) {
    bVar1 = false;
    dbgprintf("Short write to invalid addr 0x%x!\n",addr);
  }
  else {
    setByte(this,addr,(uint8_t)val,cycles);
    setByte(this,addr + 1,(uint8_t)(val >> 8),(uint32_t *)0x0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setShort(uint32_t addr, uint16_t val, uint32_t *cycles) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Short write to invalid addr 0x%x!\n", addr);
    return false;
  }
  this->setByte(addr, val & 0xFF, cycles);
  this->setByte(addr + 1, (val >> 8) & 0xFF);
  return true;
}